

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ValidateEnum(Parser *this,EnumDescriptorProto *proto)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  EnumOptions *pEVar5;
  UninterpretedOption *from;
  UninterpretedOption_NamePart *pUVar6;
  string *psVar7;
  iterator iVar8;
  ErrorMaker local_138;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>::iterator,_bool>
  local_128;
  int32_t local_10c;
  iterator local_108;
  int32_t local_f4;
  iterator local_f0;
  EnumValueDescriptorProto *local_e0;
  EnumValueDescriptorProto *enum_value;
  int i_1;
  bool has_duplicates;
  flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  used_values;
  ErrorMaker local_a8;
  int local_98;
  undefined1 local_88 [8];
  UninterpretedOption option;
  int i;
  bool allow_alias;
  bool has_allow_alias;
  EnumDescriptorProto *proto_local;
  Parser *this_local;
  
  option.field_0._79_1_ = 0;
  option.field_0._78_1_ = 0;
  option.field_0._72_4_ = 0;
  while( true ) {
    uVar1 = option.field_0._72_4_;
    pEVar5 = EnumDescriptorProto::options(proto);
    iVar3 = EnumOptions::uninterpreted_option_size(pEVar5);
    if (iVar3 <= (int)uVar1) break;
    pEVar5 = EnumDescriptorProto::options(proto);
    from = EnumOptions::uninterpreted_option(pEVar5,option.field_0._72_4_);
    UninterpretedOption::UninterpretedOption((UninterpretedOption *)local_88,from);
    iVar3 = UninterpretedOption::name_size((UninterpretedOption *)local_88);
    if (iVar3 < 2) {
      pUVar6 = UninterpretedOption::name((UninterpretedOption *)local_88,0);
      bVar2 = UninterpretedOption_NamePart::is_extension(pUVar6);
      if (!bVar2) {
        pUVar6 = UninterpretedOption::name((UninterpretedOption *)local_88,0);
        psVar7 = UninterpretedOption_NamePart::name_part_abi_cxx11_(pUVar6);
        bVar2 = std::operator==(psVar7,"allow_alias");
        if (bVar2) {
          option.field_0._79_1_ = 1;
          psVar7 = UninterpretedOption::identifier_value_abi_cxx11_((UninterpretedOption *)local_88)
          ;
          bVar2 = std::operator==(psVar7,"true");
          if (bVar2) {
            option.field_0._78_1_ = 1;
          }
          local_98 = 2;
          goto LAB_018ac3fb;
        }
      }
      local_98 = 0;
    }
    else {
      local_98 = 4;
    }
LAB_018ac3fb:
    UninterpretedOption::~UninterpretedOption((UninterpretedOption *)local_88);
    if ((local_98 != 0) && (local_98 == 2)) break;
    option.field_0._72_4_ = option.field_0._72_4_ + 1;
  }
  if (((option.field_0._79_1_ & 1) == 0) || ((option.field_0._78_1_ & 1) != 0)) {
    absl::lts_20250127::
    flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    ::flat_hash_set((flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                     *)&i_1);
    enum_value._7_1_ = 0;
    enum_value._0_4_ = 0;
    while( true ) {
      iVar3 = (int)enum_value;
      iVar4 = EnumDescriptorProto::value_size(proto);
      if (iVar4 <= iVar3) break;
      local_e0 = EnumDescriptorProto::value(proto,(int)enum_value);
      local_f4 = EnumValueDescriptorProto::number(local_e0);
      iVar8 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
              ::find<int>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                           *)&i_1,&local_f4);
      local_f0 = iVar8;
      iVar8 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
              ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                     *)&i_1);
      local_108 = iVar8;
      bVar2 = absl::lts_20250127::container_internal::operator!=(&local_f0,&local_108);
      if (bVar2) {
        enum_value._7_1_ = 1;
        break;
      }
      local_10c = EnumValueDescriptorProto::number(local_e0);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
      ::insert(&local_128,
               (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                *)&i_1,&local_10c);
      enum_value._0_4_ = (int)enum_value + 1;
    }
    if (((option.field_0._78_1_ & 1) == 0) || ((enum_value._7_1_ & 1) != 0)) {
      this_local._7_1_ = true;
    }
    else {
      ErrorMaker::
      ErrorMaker<google::protobuf::compiler::Parser::ValidateEnum(google::protobuf::EnumDescriptorProto_const*)::__1,void>
                (&local_138,(anon_class_8_1_a879b908)proto);
      RecordError(this,local_138);
      this_local._7_1_ = false;
    }
    local_98 = 1;
    absl::lts_20250127::
    flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    ::~flat_hash_set((flat_hash_set<int,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                      *)&i_1);
  }
  else {
    used_values.
    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
    heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)proto;
    ErrorMaker::
    ErrorMaker<google::protobuf::compiler::Parser::ValidateEnum(google::protobuf::EnumDescriptorProto_const*)::__0,void>
              (&local_a8,(anon_class_8_1_a879b908)proto);
    RecordError(this,local_a8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ValidateEnum(const EnumDescriptorProto* proto) {
  bool has_allow_alias = false;
  bool allow_alias = false;

  for (int i = 0; i < proto->options().uninterpreted_option_size(); i++) {
    const UninterpretedOption option = proto->options().uninterpreted_option(i);
    if (option.name_size() > 1) {
      continue;
    }
    if (!option.name(0).is_extension() &&
        option.name(0).name_part() == "allow_alias") {
      has_allow_alias = true;
      if (option.identifier_value() == "true") {
        allow_alias = true;
      }
      break;
    }
  }

  if (has_allow_alias && !allow_alias) {
    // This needlessly clutters declarations with nops.
    RecordError([=] {
      return absl::StrCat(
          "\"", proto->name(),
          "\" declares 'option allow_alias = false;' which has no effect. "
          "Please remove the declaration.");
    });
    return false;
  }

  absl::flat_hash_set<int> used_values;
  bool has_duplicates = false;
  for (int i = 0; i < proto->value_size(); ++i) {
    const EnumValueDescriptorProto& enum_value = proto->value(i);
    if (used_values.find(enum_value.number()) != used_values.end()) {
      has_duplicates = true;
      break;
    } else {
      used_values.insert(enum_value.number());
    }
  }
  if (allow_alias && !has_duplicates) {
    // Generate an error if an enum declares support for duplicate enum values
    // and does not use it protect future authors.
    RecordError([=] {
      return absl::StrCat(
          "\"", proto->name(),
          "\" declares support for enum aliases but no enum values share field "
          "numbers. Please remove the unnecessary 'option allow_alias = true;' "
          "declaration.");
    });
    return false;
  }

  return true;
}